

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlc.c
# Opt level: O0

TA_RetCode
do_call(TA_Test_conflict10 *test,double *high,double *low,double *close,int *outBegIdx,
       int *outNbElement,double *output)

{
  double *in_RCX;
  double *in_RDX;
  int *unaff_RBX;
  double *unaff_RBP;
  double *in_RSI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double *unaff_R14;
  double *unaff_retaddr;
  double *in_stack_00000008;
  TA_Real *dummyBuffer2;
  TA_Real *dummyBuffer1;
  TA_RetCode retCode;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000090;
  int in_stack_00000098;
  undefined4 in_stack_000000a8;
  int in_stack_000000ac;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  double *in_stack_000000c0;
  int in_stack_000000cc;
  int in_stack_000000d0;
  int *in_stack_000000e0;
  int *in_stack_000000e8;
  double *in_stack_000000f0;
  void *local_68;
  void *local_60;
  int in_stack_ffffffffffffffac;
  TA_RetCode TVar1;
  int endIdx;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(int *)(in_RDI + 4) == 4) {
    local_60 = malloc((long)((*(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8)) + 1) << 3);
    if (local_60 == (void *)0x0) {
      return TA_ALLOC_ERR;
    }
    local_68 = malloc((long)((*(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8)) + 1) << 3);
    if (local_68 == (void *)0x0) {
      free(local_60);
      return TA_ALLOC_ERR;
    }
  }
  else {
    local_60 = (void *)0x0;
    local_68 = (void *)0x0;
  }
  endIdx = (int)((ulong)in_RDX >> 0x20);
  switch(*(undefined4 *)(in_RDI + 4)) {
  case 0:
    TVar1 = TA_CCI(in_stack_000000d0,in_stack_000000cc,in_stack_000000c0,in_stack_000000b8,
                   in_stack_000000b0,in_stack_000000ac,in_stack_000000e0,in_stack_000000e8,
                   in_stack_000000f0);
    break;
  case 1:
    TVar1 = TA_WILLR(*(int *)(in_RDI + 8),*(int *)(in_RDI + 0xc),in_RSI,in_RDX,in_RCX,
                     *(int *)(in_RDI + 0x10),(int *)in_R8,(int *)in_R9,in_stack_00000008);
    break;
  case 2:
    TVar1 = TA_ULTOSC(in_stack_00000080,in_stack_0000007c,(double *)test,high,low,close._4_4_,
                      in_stack_00000090,in_stack_00000098,(int *)output,
                      (int *)CONCAT44(in_stack_000000ac,in_stack_000000a8),in_stack_000000b0);
    break;
  case 3:
    TVar1 = TA_NATR((int)in_RSI,endIdx,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffac,
                    (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),unaff_RBX,
                    unaff_R14);
    break;
  case 4:
    TVar1 = TA_ACCBANDS((int)in_RSI,endIdx,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffac,
                        (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        unaff_RBX,unaff_R14,unaff_RBP,unaff_retaddr);
    break;
  default:
    TVar1 = 0x140d;
  }
  if (local_60 != (void *)0x0) {
    free(local_60);
  }
  if (local_68 != (void *)0x0) {
    free(local_68);
  }
  return TVar1;
}

Assistant:

static TA_RetCode do_call( const TA_Test *test,
                            const double high[],
                            const double low[],
                            const double close[],
                            int *outBegIdx,
                            int *outNbElement,
                            double output[] )
{
   TA_RetCode retCode;
   TA_Real *dummyBuffer1, *dummyBuffer2;

   if( test->theFunction != TA_ACCBANDS_TEST )
   {
	   dummyBuffer1 = NULL;
	   dummyBuffer2 = NULL;
   }
   else
   {
	   dummyBuffer1 = TA_Malloc( ((test->endIdx-test->startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer1 )
		 return TA_ALLOC_ERR;

	   dummyBuffer2 = TA_Malloc( ((test->endIdx-test->startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer2 )
	   {
		  TA_Free( dummyBuffer1 );
		  return TA_ALLOC_ERR;
	   }
   }

   switch( test->theFunction )
   {
   case TA_NATR_TEST:
      retCode = TA_NATR( test->startIdx,
                         test->endIdx,
                         high, low, close,
                         test->optInTimePeriod1,
                         outBegIdx,
                         outNbElement,
                         output );
      break;

   case TA_CCI_TEST:
      retCode = TA_CCI( test->startIdx,
                        test->endIdx,
                        high, low, close,
                        test->optInTimePeriod1,
                        outBegIdx,
                        outNbElement,
                        output );
      break;

   case TA_WILLR_TEST:
      retCode = TA_WILLR( test->startIdx,
                          test->endIdx,
                          high, low, close,
                          test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          output );
      break;

   case TA_ULTOSC_TEST:
      retCode = TA_ULTOSC( test->startIdx,
                           test->endIdx,
                           high, low, close,
                           test->optInTimePeriod1,
                           test->optInTimePeriod2,
                           test->optInTimePeriod3,
                           outBegIdx,
                           outNbElement,
                           output );
      break;

   case TA_ACCBANDS_TEST:
	   /* TODO: replace dummy with real for more complete tests. */
      retCode = TA_ACCBANDS( test->startIdx,
                          test->endIdx,
                          high, low, close,
                          test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          dummyBuffer1, output, dummyBuffer2 );
      break;

   default:
      retCode = TA_INTERNAL_ERROR(133);
   }

   FREE_IF_NOT_NULL( dummyBuffer1 );
   FREE_IF_NOT_NULL( dummyBuffer2 );

   return retCode;
}